

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::ProcessHorizontal(Clipper *this,TEdge *horzEdge)

{
  MaximaList *pMVar1;
  double dVar2;
  int iVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  long lVar7;
  _func_int *p_Var8;
  bool bVar9;
  long lVar10;
  OutPt *pOVar11;
  OutPt *pOVar12;
  TEdge *pTVar13;
  long lVar14;
  long lVar15;
  _Self __tmp;
  _List_node_base *p_Var16;
  TEdge *pTVar17;
  long lVar18;
  TEdge *e1;
  TEdge *pTVar19;
  _List_node_base *p_Var20;
  TEdge **ppTVar21;
  IntPoint OffPt;
  IntPoint OffPt_00;
  IntPoint Pt;
  IntPoint local_a0;
  IntPoint *local_90;
  TEdge *local_88;
  OutPt *local_80;
  TEdge *local_78;
  TEdge *local_70;
  TEdge **local_68;
  TEdge *local_60;
  long local_58;
  long local_50;
  long local_48;
  _List_node_base *local_40;
  TEdge *local_38;
  
  lVar14 = (horzEdge->Bot).X;
  lVar10 = (horzEdge->Top).X;
  local_58 = lVar10;
  if (lVar14 < lVar10) {
    local_58 = lVar14;
  }
  iVar3 = horzEdge->WindDelta;
  local_50 = lVar10;
  if (lVar10 < lVar14) {
    local_50 = lVar14;
  }
  bVar9 = lVar14 < lVar10;
  local_60 = (TEdge *)0x0;
  pTVar13 = horzEdge;
  while (local_88 = pTVar13, pTVar13 = local_88->NextInLML, local_78 = horzEdge,
        pTVar13 != (TEdge *)0x0) {
    if ((pTVar13->Dx != -1e+40) || (NAN(pTVar13->Dx))) goto LAB_00116dc4;
  }
  local_60 = GetMaximaPair(local_88);
LAB_00116dc4:
  pMVar1 = &this->m_Maxima;
  if ((this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
      _M_size == 0) {
    p_Var20 = (_List_node_base *)0x0;
  }
  else {
    if (lVar14 < lVar10) {
      p_Var20 = (_List_node_base *)0x0;
      p_Var16 = (_List_node_base *)pMVar1;
      do {
        p_Var16 = (((_List_base<long_long,_std::allocator<long_long>_> *)&p_Var16->_M_next)->_M_impl
                  )._M_node.super__List_node_base._M_next;
        if (p_Var16 == (_List_node_base *)pMVar1) goto LAB_00116e2e;
      } while ((long)p_Var16[1]._M_next <= lVar14);
      if ((local_88->Top).X <= (long)p_Var16[1]._M_next) {
        p_Var16 = (_List_node_base *)pMVar1;
      }
      p_Var20 = (_List_node_base *)0x0;
      goto LAB_00116e2e;
    }
    p_Var4 = (pMVar1->super__List_base<long_long,_std::allocator<long_long>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var16 = (_List_node_base *)0x0;
    p_Var6 = (_List_node_base *)pMVar1;
    do {
      p_Var20 = p_Var6;
      if (p_Var20 == p_Var4) goto LAB_00116e2e;
      p_Var5 = p_Var20->_M_prev[1]._M_next;
      p_Var6 = p_Var20->_M_prev;
    } while (lVar14 < (long)p_Var5);
    if ((long)p_Var5 <= (local_88->Top).X) {
      p_Var20 = p_Var4;
    }
  }
  p_Var16 = (_List_node_base *)0x0;
LAB_00116e2e:
  local_68 = &this->m_SortedEdges;
  local_80 = (OutPt *)0x0;
  do {
    local_48 = (ulong)(byte)~bVar9 * 8 + 0x68;
    pTVar13 = (&horzEdge->NextInAEL)[(byte)~bVar9];
    local_90 = &horzEdge->Top;
    local_38 = horzEdge;
    while (pTVar13 != (TEdge *)0x0) {
      local_70 = pTVar13;
      if ((this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
          _M_size != 0) {
        p_Var4 = p_Var20;
        if (bVar9 == false) {
          while (p_Var20 = p_Var4,
                p_Var20 !=
                (pMVar1->super__List_base<long_long,_std::allocator<long_long>_>)._M_impl._M_node.
                super__List_node_base._M_next) {
            p_Var6 = p_Var20->_M_prev[1]._M_next;
            if ((long)p_Var6 <= (pTVar13->Curr).X) break;
            p_Var4 = p_Var20->_M_prev;
            if (-1 < horzEdge->OutIdx && iVar3 != 0) {
              local_a0.Y = (horzEdge->Bot).Y;
              local_a0.X = (cInt)p_Var6;
              AddOutPt(this,horzEdge,&local_a0);
              pTVar13 = local_70;
              p_Var4 = p_Var20->_M_prev;
            }
          }
        }
        else {
          for (; (p_Var16 != (_List_node_base *)pMVar1 &&
                 ((long)p_Var16[1]._M_next < (pTVar13->Curr).X)); p_Var16 = p_Var16->_M_next) {
            if (-1 < horzEdge->OutIdx && iVar3 != 0) {
              local_a0.Y = (horzEdge->Bot).Y;
              local_a0.X = (cInt)p_Var16[1]._M_next;
              AddOutPt(this,horzEdge,&local_a0);
              pTVar13 = local_70;
            }
          }
        }
      }
      lVar14 = (pTVar13->Curr).X;
      if (bVar9 == false) {
        if (lVar14 < local_58) break;
      }
      else if (local_50 < lVar14) break;
      if (((lVar14 == local_90->X) && (horzEdge->NextInLML != (TEdge *)0x0)) &&
         (dVar2 = horzEdge->NextInLML->Dx, pTVar13->Dx <= dVar2 && dVar2 != pTVar13->Dx)) break;
      pTVar17 = pTVar13;
      pTVar19 = horzEdge;
      local_40 = p_Var20;
      if (-1 < horzEdge->OutIdx && iVar3 != 0) {
        local_80 = AddOutPt(this,horzEdge,&pTVar13->Curr);
        ppTVar21 = local_68;
        while (pTVar13 = *ppTVar21, pTVar13 != (TEdge *)0x0) {
          if (-1 < pTVar13->OutIdx) {
            lVar14 = (horzEdge->Bot).X;
            lVar10 = (horzEdge->Top).X;
            lVar15 = (pTVar13->Bot).X;
            lVar7 = (pTVar13->Top).X;
            lVar18 = lVar10;
            if (lVar14 < lVar10) {
              lVar18 = lVar14;
            }
            if (lVar10 < lVar14) {
              lVar10 = lVar14;
            }
            lVar14 = lVar7;
            if (lVar15 < lVar7) {
              lVar14 = lVar15;
            }
            if (lVar15 <= lVar7) {
              lVar15 = lVar7;
            }
            if ((lVar18 < lVar15) && (lVar14 < lVar10)) {
              pOVar11 = GetLastOutPt(this,pTVar13);
              horzEdge = local_38;
              OffPt.Y = (pTVar13->Top).Y;
              OffPt.X = lVar7;
              AddJoin(this,pOVar11,local_80,OffPt);
            }
          }
          ppTVar21 = &pTVar13->NextInSEL;
        }
        AddGhostJoin(this,local_80,horzEdge->Bot);
        pTVar17 = local_70;
        pTVar19 = horzEdge;
      }
      horzEdge = local_60;
      if ((pTVar19 == local_88) && (pTVar17 == local_60)) {
        if (-1 < pTVar19->OutIdx) {
          AddLocalMaxPoly(this,pTVar19,local_60,local_90);
        }
        ClipperBase::DeleteFromAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   pTVar19);
        p_Var8 = this->_vptr_Clipper[-3];
        goto LAB_001171b4;
      }
      if (bVar9 == false) {
        local_a0.X = (pTVar17->Curr).X;
        local_a0.Y = (pTVar19->Curr).Y;
        pTVar13 = pTVar19;
        e1 = pTVar17;
      }
      else {
        local_a0.X = (pTVar17->Curr).X;
        local_a0.Y = (pTVar19->Curr).Y;
        pTVar13 = pTVar17;
        e1 = pTVar19;
      }
      IntersectEdges(this,e1,pTVar13,&local_a0);
      pTVar13 = *(TEdge **)((long)&(pTVar17->Bot).X + local_48);
      ClipperBase::SwapPositionsInAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),pTVar19
                 ,pTVar17);
      p_Var20 = local_40;
      horzEdge = pTVar19;
    }
    pTVar13 = horzEdge->NextInLML;
    if (((pTVar13 == (TEdge *)0x0) || (pTVar13->Dx != -1e+40)) || (NAN(pTVar13->Dx))) {
      if ((-1 < horzEdge->OutIdx) && (local_80 == (OutPt *)0x0)) {
        pOVar11 = GetLastOutPt(this,horzEdge);
        ppTVar21 = local_68;
        while (pTVar13 = *ppTVar21, pTVar13 != (TEdge *)0x0) {
          if (-1 < pTVar13->OutIdx) {
            lVar14 = (horzEdge->Bot).X;
            lVar10 = (horzEdge->Top).X;
            lVar15 = (pTVar13->Bot).X;
            lVar7 = (pTVar13->Top).X;
            lVar18 = lVar10;
            if (lVar14 < lVar10) {
              lVar18 = lVar14;
            }
            if (lVar10 < lVar14) {
              lVar10 = lVar14;
            }
            lVar14 = lVar7;
            if (lVar15 < lVar7) {
              lVar14 = lVar15;
            }
            if (lVar15 <= lVar7) {
              lVar15 = lVar7;
            }
            if ((lVar18 < lVar15) && (lVar14 < lVar10)) {
              pOVar12 = GetLastOutPt(this,pTVar13);
              OffPt_00.Y = (pTVar13->Top).Y;
              OffPt_00.X = lVar7;
              AddJoin(this,pOVar12,pOVar11,OffPt_00);
            }
          }
          ppTVar21 = &pTVar13->NextInSEL;
        }
        AddGhostJoin(this,pOVar11,horzEdge->Top);
        pTVar13 = horzEdge->NextInLML;
      }
      if (pTVar13 != (TEdge *)0x0) {
        if (horzEdge->OutIdx < 0) {
          ClipperBase::UpdateEdgeIntoAEL
                    ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                     &local_78);
        }
        else {
          pOVar11 = AddOutPt(this,horzEdge,local_90);
          ClipperBase::UpdateEdgeIntoAEL
                    ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                     &local_78);
          pTVar13 = local_78;
          if (local_78->WindDelta != 0) {
            pTVar17 = local_78->NextInAEL;
            pTVar19 = local_78->PrevInAEL;
            if ((((((pTVar19 != (TEdge *)0x0) && ((pTVar19->Curr).X == (local_78->Bot).X)) &&
                  (lVar14 = (pTVar19->Curr).Y, lVar14 == (local_78->Bot).Y)) &&
                 ((pTVar19->WindDelta != 0 && (-1 < pTVar19->OutIdx)))) &&
                (((pTVar19->Top).Y < lVar14 &&
                 (bVar9 = SlopesEqual(local_78,pTVar19,
                                      (bool)(this->_vptr_Clipper[-3] + 8)
                                            [(long)&(this->m_GhostJoins).
                                                                                                        
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                            ]), bVar9)))) ||
               ((((pTVar17 != (TEdge *)0x0 && ((pTVar17->Curr).X == (pTVar13->Bot).X)) &&
                 (lVar14 = (pTVar17->Curr).Y, lVar14 == (pTVar13->Bot).Y)) &&
                ((((pTVar17->WindDelta != 0 && (-1 < pTVar17->OutIdx)) &&
                  ((pTVar17->Top).Y < lVar14)) &&
                 (bVar9 = SlopesEqual(pTVar13,pTVar17,
                                      (bool)(this->_vptr_Clipper[-3] + 8)
                                            [(long)&(this->m_GhostJoins).
                                                                                                        
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                            ]), pTVar19 = pTVar17, bVar9)))))) {
              pOVar12 = AddOutPt(this,pTVar19,&pTVar13->Bot);
              AddJoin(this,pOVar11,pOVar12,pTVar13->Top);
              return;
            }
          }
        }
        return;
      }
      if (-1 < horzEdge->OutIdx) {
        AddOutPt(this,horzEdge,local_90);
      }
      p_Var8 = this->_vptr_Clipper[-3];
LAB_001171b4:
      ClipperBase::DeleteFromAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)p_Var8),horzEdge);
      return;
    }
    ClipperBase::UpdateEdgeIntoAEL
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),&local_78
              );
    horzEdge = local_78;
    if (-1 < local_78->OutIdx) {
      AddOutPt(this,local_78,&local_78->Bot);
    }
    lVar14 = (horzEdge->Bot).X;
    local_50 = (horzEdge->Top).X;
    bVar9 = lVar14 < local_50;
    local_58 = local_50;
    if (lVar14 < local_50) {
      local_58 = lVar14;
    }
    if (local_50 < lVar14) {
      local_50 = lVar14;
    }
  } while( true );
}

Assistant:

void Clipper::ProcessHorizontal(TEdge *horzEdge)
{
  Direction dir;
  cInt horzLeft, horzRight;
  bool IsOpen = (horzEdge->WindDelta == 0);

  GetHorzDirection(*horzEdge, dir, horzLeft, horzRight);

  TEdge* eLastHorz = horzEdge, *eMaxPair = 0;
  while (eLastHorz->NextInLML && IsHorizontal(*eLastHorz->NextInLML)) 
    eLastHorz = eLastHorz->NextInLML;
  if (!eLastHorz->NextInLML)
    eMaxPair = GetMaximaPair(eLastHorz);

  MaximaList::const_iterator maxIt;
  MaximaList::const_reverse_iterator maxRit;
  if (m_Maxima.size() > 0)
  {
      //get the first maxima in range (X) ...
      if (dir == dLeftToRight)
      {
          maxIt = m_Maxima.begin();
          while (maxIt != m_Maxima.end() && *maxIt <= horzEdge->Bot.X) maxIt++;
          if (maxIt != m_Maxima.end() && *maxIt >= eLastHorz->Top.X)
              maxIt = m_Maxima.end();
      }
      else
      {
          maxRit = m_Maxima.rbegin();
          while (maxRit != m_Maxima.rend() && *maxRit > horzEdge->Bot.X) maxRit++;
          if (maxRit != m_Maxima.rend() && *maxRit <= eLastHorz->Top.X)
              maxRit = m_Maxima.rend();
      }
  }

  OutPt* op1 = 0;

  for (;;) //loop through consec. horizontal edges
  {
		  
    bool IsLastHorz = (horzEdge == eLastHorz);
    TEdge* e = GetNextInAEL(horzEdge, dir);
    while(e)
    {

        //this code block inserts extra coords into horizontal edges (in output
        //polygons) whereever maxima touch these horizontal edges. This helps
        //'simplifying' polygons (ie if the Simplify property is set).
        if (m_Maxima.size() > 0)
        {
            if (dir == dLeftToRight)
            {
                while (maxIt != m_Maxima.end() && *maxIt < e->Curr.X) 
                {
                  if (horzEdge->OutIdx >= 0 && !IsOpen)
                    AddOutPt(horzEdge, IntPoint(*maxIt, horzEdge->Bot.Y));
                  maxIt++;
                }
            }
            else
            {
                while (maxRit != m_Maxima.rend() && *maxRit > e->Curr.X)
                {
                  if (horzEdge->OutIdx >= 0 && !IsOpen)
                    AddOutPt(horzEdge, IntPoint(*maxRit, horzEdge->Bot.Y));
                  maxRit++;
                }
            }
        };

        if ((dir == dLeftToRight && e->Curr.X > horzRight) ||
			(dir == dRightToLeft && e->Curr.X < horzLeft)) break;

		//Also break if we've got to the end of an intermediate horizontal edge ...
		//nb: Smaller Dx's are to the right of larger Dx's ABOVE the horizontal.
		if (e->Curr.X == horzEdge->Top.X && horzEdge->NextInLML && 
			e->Dx < horzEdge->NextInLML->Dx) break;

    if (horzEdge->OutIdx >= 0 && !IsOpen)  //note: may be done multiple times
		{
#ifdef use_xyz
			if (dir == dLeftToRight) SetZ(e->Curr, *horzEdge, *e);
			else SetZ(e->Curr, *e, *horzEdge);
#endif      
			op1 = AddOutPt(horzEdge, e->Curr);
			TEdge* eNextHorz = m_SortedEdges;
			while (eNextHorz)
			{
				if (eNextHorz->OutIdx >= 0 &&
					HorzSegmentsOverlap(horzEdge->Bot.X,
					horzEdge->Top.X, eNextHorz->Bot.X, eNextHorz->Top.X))
				{
                    OutPt* op2 = GetLastOutPt(eNextHorz);
                    AddJoin(op2, op1, eNextHorz->Top);
				}
				eNextHorz = eNextHorz->NextInSEL;
			}
			AddGhostJoin(op1, horzEdge->Bot);
		}
		
		//OK, so far we're still in range of the horizontal Edge  but make sure
        //we're at the last of consec. horizontals when matching with eMaxPair
        if(e == eMaxPair && IsLastHorz)
        {
          if (horzEdge->OutIdx >= 0)
            AddLocalMaxPoly(horzEdge, eMaxPair, horzEdge->Top);
          DeleteFromAEL(horzEdge);
          DeleteFromAEL(eMaxPair);
          return;
        }
        
		if(dir == dLeftToRight)
        {
          IntPoint Pt = IntPoint(e->Curr.X, horzEdge->Curr.Y);
          IntersectEdges(horzEdge, e, Pt);
        }
        else
        {
          IntPoint Pt = IntPoint(e->Curr.X, horzEdge->Curr.Y);
          IntersectEdges( e, horzEdge, Pt);
        }
        TEdge* eNext = GetNextInAEL(e, dir);
        SwapPositionsInAEL( horzEdge, e );
        e = eNext;
    } //end while(e)

	//Break out of loop if HorzEdge.NextInLML is not also horizontal ...
	if (!horzEdge->NextInLML || !IsHorizontal(*horzEdge->NextInLML)) break;

	UpdateEdgeIntoAEL(horzEdge);
    if (horzEdge->OutIdx >= 0) AddOutPt(horzEdge, horzEdge->Bot);
    GetHorzDirection(*horzEdge, dir, horzLeft, horzRight);

  } //end for (;;)

  if (horzEdge->OutIdx >= 0 && !op1)
  {
      op1 = GetLastOutPt(horzEdge);
      TEdge* eNextHorz = m_SortedEdges;
      while (eNextHorz)
      {
          if (eNextHorz->OutIdx >= 0 &&
              HorzSegmentsOverlap(horzEdge->Bot.X,
              horzEdge->Top.X, eNextHorz->Bot.X, eNextHorz->Top.X))
          {
              OutPt* op2 = GetLastOutPt(eNextHorz);
              AddJoin(op2, op1, eNextHorz->Top);
          }
          eNextHorz = eNextHorz->NextInSEL;
      }
      AddGhostJoin(op1, horzEdge->Top);
  }

  if (horzEdge->NextInLML)
  {
    if(horzEdge->OutIdx >= 0)
    {
      op1 = AddOutPt( horzEdge, horzEdge->Top);
      UpdateEdgeIntoAEL(horzEdge);
      if (horzEdge->WindDelta == 0) return;
      //nb: HorzEdge is no longer horizontal here
      TEdge* ePrev = horzEdge->PrevInAEL;
      TEdge* eNext = horzEdge->NextInAEL;
      if (ePrev && ePrev->Curr.X == horzEdge->Bot.X &&
        ePrev->Curr.Y == horzEdge->Bot.Y && ePrev->WindDelta != 0 &&
        (ePrev->OutIdx >= 0 && ePrev->Curr.Y > ePrev->Top.Y &&
        SlopesEqual(*horzEdge, *ePrev, m_UseFullRange)))
      {
        OutPt* op2 = AddOutPt(ePrev, horzEdge->Bot);
        AddJoin(op1, op2, horzEdge->Top);
      }
      else if (eNext && eNext->Curr.X == horzEdge->Bot.X &&
        eNext->Curr.Y == horzEdge->Bot.Y && eNext->WindDelta != 0 &&
        eNext->OutIdx >= 0 && eNext->Curr.Y > eNext->Top.Y &&
        SlopesEqual(*horzEdge, *eNext, m_UseFullRange))
      {
        OutPt* op2 = AddOutPt(eNext, horzEdge->Bot);
        AddJoin(op1, op2, horzEdge->Top);
      }
    }
    else
      UpdateEdgeIntoAEL(horzEdge); 
  }
  else
  {
    if (horzEdge->OutIdx >= 0) AddOutPt(horzEdge, horzEdge->Top);
    DeleteFromAEL(horzEdge);
  }
}